

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall
xray_re::cse_alife_object_physic::update_write(cse_alife_object_physic *this,xr_packet *packet)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined8 uVar8;
  ulong uVar9;
  
  uVar4 = (this->super_cse_alife_dynamic_object_visual).super_cse_alife_dynamic_object.
          super_cse_alife_object.super_cse_abstract.m_version;
  if (uVar4 < 0x7a) {
    return;
  }
  if (uVar4 < 0x81) {
    if (this->m_num_items == 0) {
      UNRECOVERED_JUMPTABLE = packet->_vptr_xr_packet[10];
      uVar8 = 0;
    }
    else {
      bVar6 = this->m_num_items & 0x1f;
      bVar7 = bVar6 | 0x20;
      if ((this->m_state).enabled == false) {
        bVar7 = bVar6;
      }
      fVar1 = (this->m_state).angular_vel.field_0.field_0.x;
      fVar2 = (this->m_state).angular_vel.field_0.field_0.y;
      fVar3 = (this->m_state).angular_vel.field_0.field_0.z;
      uVar5 = bVar7 + 0x40;
      if (1e-07 <= fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2) {
        uVar5 = (uint)bVar7;
      }
      fVar1 = (this->m_state).linear_vel.field_0.field_0.x;
      fVar2 = (this->m_state).linear_vel.field_0.field_0.y;
      fVar3 = (this->m_state).linear_vel.field_0.field_0.z;
      uVar9 = (ulong)(byte)((byte)uVar5 | 0x80);
      if (1e-07 <= fVar3 * fVar3 + fVar1 * fVar1 + fVar2 * fVar2) {
        uVar9 = (ulong)uVar5;
      }
      (*packet->_vptr_xr_packet[10])(packet,uVar9);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).force);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).torque);
      (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).position);
      (*packet->_vptr_xr_packet[0xd])((this->m_state).field_6.max_velocity,packet);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 4),packet);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 8),packet);
      (*packet->_vptr_xr_packet[0xd])(*(undefined4 *)((long)&(this->m_state).field_6 + 0xc),packet);
      if ((uVar9 & 0x40) == 0) {
        (*packet->_vptr_xr_packet[0xf])(packet,&(this->m_state).angular_vel);
      }
      if (-1 < (char)uVar9) {
        (*packet->_vptr_xr_packet[0xf])(packet,&this->m_state);
      }
      UNRECOVERED_JUMPTABLE = packet->_vptr_xr_packet[0xc];
      uVar8 = 1;
    }
    (*UNRECOVERED_JUMPTABLE)(packet,uVar8);
    return;
  }
  __assert_fail("m_version <= CSE_VERSION_COP",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                ,0x282,"virtual void xray_re::cse_alife_object_physic::update_write(xr_packet &)");
}

Assistant:

void cse_alife_object_physic::update_write(xr_packet& packet)
{
	cse_ph_skeleton::update_write(packet);
	if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_COP);
		if (m_num_items) {
			uint8_t num_items = uint8_t(m_num_items & 0x1f);
			if (m_state.enabled)
				num_items |= 0x20;
			if (m_state.angular_vel.square_magnitude() < 1e-7f)
				num_items |= 0x40;
			if (m_state.linear_vel.square_magnitude() < 1e-7f)
				num_items |= 0x80;
			packet.w_u8(num_items);
			packet.w_vec3(m_state.force);
			packet.w_vec3(m_state.torque);
			packet.w_vec3(m_state.position);
			packet.w_float(m_state.quaternion.x);
			packet.w_float(m_state.quaternion.y);
			packet.w_float(m_state.quaternion.z);
			packet.w_float(m_state.quaternion.w);
			if ((num_items & 0x40) == 0)
				packet.w_vec3(m_state.angular_vel);
			if ((num_items & 0x80) == 0)
				packet.w_vec3(m_state.linear_vel);
			packet.w_bool(true);
		} else {
			packet.w_u8(0);
		}
	}
}